

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O3

void AES_encrypt(uchar *in,uchar *out,AES_KEY *key)

{
  char cVar1;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [16];
  undefined1 auVar16 [14];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int c;
  int iVar19;
  uchar *in_RCX;
  int iVar20;
  uchar *puVar21;
  int b;
  long lVar22;
  byte bVar23;
  short sVar24;
  byte bVar39;
  ushort uVar40;
  byte bVar41;
  ushort uVar42;
  undefined4 uVar43;
  byte bVar44;
  ushort uVar46;
  ushort uVar48;
  ushort uVar50;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  ushort uVar45;
  ushort uVar47;
  ushort uVar49;
  ushort uVar51;
  ushort uVar52;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ulong uVar55;
  AES_state s;
  AES_state local_38;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  undefined6 uVar25;
  undefined1 auVar26 [14];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar28 [16];
  undefined1 auVar36 [16];
  
  local_38.slice[0] = 0;
  local_38.slice[1] = 0;
  local_38.slice[2] = 0;
  local_38.slice[3] = 0;
  local_38.slice[4] = 0;
  local_38.slice[5] = 0;
  local_38.slice[6] = 0;
  local_38.slice[7] = 0;
  LoadBytes(&local_38,in_RCX);
  local_38.slice._0_8_ = *(ulong *)in ^ local_38.slice._0_8_;
  local_38.slice._8_8_ = *(ulong *)(in + 8) ^ local_38.slice._8_8_;
  if (1 < (int)out) {
    iVar20 = (int)out + -1;
    puVar21 = in;
    do {
      in = puVar21 + 0x10;
      SubBytes(&local_38,0);
      ShiftRows(&local_38);
      MixColumns(&local_38,0);
      local_38.slice._0_8_ = *(ulong *)(puVar21 + 0x10) ^ local_38.slice._0_8_;
      local_38.slice._8_8_ = *(ulong *)(puVar21 + 0x18) ^ local_38.slice._8_8_;
      iVar20 = iVar20 + -1;
      puVar21 = in;
    } while (iVar20 != 0);
  }
  lVar22 = 0;
  SubBytes(&local_38,0);
  ShiftRows(&local_38);
  auVar18 = _DAT_0058c630;
  auVar17 = _DAT_0058c620;
  do {
    local_38.slice[lVar22] = local_38.slice[lVar22] ^ *(ushort *)(in + lVar22 * 2 + 0x10);
    lVar22 = lVar22 + 1;
  } while (lVar22 != 8);
  iVar20 = 0;
  do {
    iVar19 = 0;
    do {
      auVar15._8_2_ = local_38.slice[4];
      auVar15._10_2_ = local_38.slice[5];
      auVar15._12_2_ = local_38.slice[6];
      auVar15._14_2_ = local_38.slice[7];
      auVar15._0_2_ = local_38.slice[0];
      auVar15._2_2_ = local_38.slice[1];
      auVar15._4_2_ = local_38.slice[2];
      auVar15._6_2_ = local_38.slice[3];
      auVar12._10_2_ = 0;
      auVar12._0_10_ = auVar15._0_10_;
      auVar12._12_2_ = local_38.slice[3];
      auVar13._8_2_ = local_38.slice[2];
      auVar13._0_2_ = local_38.slice[0];
      auVar13._2_2_ = local_38.slice[1];
      auVar13._4_2_ = local_38.slice[2];
      auVar13._6_2_ = local_38.slice[3];
      auVar13._10_4_ = auVar12._10_4_;
      auVar16._6_8_ = 0;
      auVar16._0_6_ = auVar13._8_6_;
      auVar14._4_2_ = local_38.slice[1];
      auVar14._0_4_ = local_38.slice._0_4_;
      auVar14._6_8_ = SUB148(auVar16 << 0x40,6);
      uVar55 = (ulong)(uint)(iVar20 + iVar19);
      auVar27._0_4_ = (local_38.slice._0_4_ & 0xffff) >> uVar55;
      auVar27._4_4_ = auVar14._4_4_ >> uVar55;
      auVar27._8_4_ = auVar13._8_4_ >> uVar55;
      auVar27._12_2_ = local_38.slice[3] >> uVar55;
      auVar27._14_2_ = 0;
      auVar53._2_2_ = 0;
      auVar53._0_2_ = local_38.slice[4] >> uVar55;
      auVar53._4_2_ = local_38.slice[5] >> uVar55;
      auVar53._6_2_ = 0;
      auVar53._8_2_ = local_38.slice[6] >> uVar55;
      auVar53._10_2_ = 0;
      auVar53._12_2_ = local_38.slice[7] >> uVar55;
      auVar53._14_2_ = 0;
      auVar53 = auVar53 & auVar17;
      auVar27 = auVar27 & auVar17;
      sVar7 = auVar27._0_2_;
      cVar1 = (0 < sVar7) * (sVar7 < 0x100) * auVar27[0] - (0xff < sVar7);
      sVar7 = auVar27._2_2_;
      sVar24 = CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar27[2] - (0xff < sVar7),cVar1);
      sVar7 = auVar27._4_2_;
      cVar2 = (0 < sVar7) * (sVar7 < 0x100) * auVar27[4] - (0xff < sVar7);
      sVar7 = auVar27._6_2_;
      uVar43 = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar27[6] - (0xff < sVar7),
                        CONCAT12(cVar2,sVar24));
      sVar7 = auVar27._8_2_;
      cVar3 = (0 < sVar7) * (sVar7 < 0x100) * auVar27[8] - (0xff < sVar7);
      sVar7 = auVar27._10_2_;
      uVar25 = CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar27[10] - (0xff < sVar7),
                        CONCAT14(cVar3,uVar43));
      sVar7 = auVar27._12_2_;
      cVar4 = (0 < sVar7) * (sVar7 < 0x100) * auVar27[0xc] - (0xff < sVar7);
      sVar7 = auVar27._14_2_;
      auVar26._0_8_ =
           CONCAT17((0 < sVar7) * (sVar7 < 0x100) * auVar27[0xe] - (0xff < sVar7),
                    CONCAT16(cVar4,uVar25));
      sVar7 = auVar53._0_2_;
      bVar23 = (0 < sVar7) * (sVar7 < 0x100) * auVar53[0] - (0xff < sVar7);
      auVar26[8] = bVar23;
      auVar26[9] = 0;
      sVar7 = auVar53._4_2_;
      bVar39 = (0 < sVar7) * (sVar7 < 0x100) * auVar53[4] - (0xff < sVar7);
      auVar26[10] = bVar39;
      auVar26[0xb] = 0;
      sVar7 = auVar53._8_2_;
      cVar5 = (0 < sVar7) * (sVar7 < 0x100) * auVar53[8] - (0xff < sVar7);
      auVar26[0xc] = cVar5;
      sVar7 = auVar53._10_2_;
      auVar26[0xd] = (0 < sVar7) * (sVar7 < 0x100) * auVar53[10] - (0xff < sVar7);
      sVar7 = auVar53._12_2_;
      cVar6 = (0 < sVar7) * (sVar7 < 0x100) * auVar53[0xc] - (0xff < sVar7);
      auVar28[0xe] = cVar6;
      auVar28._0_14_ = auVar26;
      sVar7 = auVar53._14_2_;
      auVar28[0xf] = (0 < sVar7) * (sVar7 < 0x100) * auVar53[0xe] - (0xff < sVar7);
      sVar7 = (short)((uint)uVar43 >> 0x10);
      auVar29[1] = (0 < sVar7) * (sVar7 < 0x100) * cVar2 - (0xff < sVar7);
      auVar29[0] = (0 < sVar24) * (sVar24 < 0x100) * cVar1 - (0xff < sVar24);
      sVar8 = (short)((uint6)uVar25 >> 0x20);
      auVar29[2] = (0 < sVar8) * (sVar8 < 0x100) * cVar3 - (0xff < sVar8);
      sVar9 = (short)((ulong)auVar26._0_8_ >> 0x30);
      auVar29[3] = (0 < sVar9) * (sVar9 < 0x100) * cVar4 - (0xff < sVar9);
      uVar40 = (ushort)bVar23;
      auVar29[4] = (bVar23 != 0) * (uVar40 < 0x100) * bVar23 - (0xff < uVar40);
      uVar42 = (ushort)bVar39;
      auVar29[5] = (bVar39 != 0) * (uVar42 < 0x100) * bVar39 - (0xff < uVar42);
      sVar10 = auVar26._12_2_;
      auVar29[6] = (0 < sVar10) * (sVar10 < 0x100) * cVar5 - (0xff < sVar10);
      sVar11 = auVar28._14_2_;
      auVar29[7] = (0 < sVar11) * (sVar11 < 0x100) * cVar6 - (0xff < sVar11);
      auVar29[8] = (0 < sVar24) * (sVar24 < 0x100) * cVar1 - (0xff < sVar24);
      auVar29[9] = (0 < sVar7) * (sVar7 < 0x100) * cVar2 - (0xff < sVar7);
      auVar29[10] = (0 < sVar8) * (sVar8 < 0x100) * cVar3 - (0xff < sVar8);
      auVar29[0xb] = (0 < sVar9) * (sVar9 < 0x100) * cVar4 - (0xff < sVar9);
      auVar29[0xc] = (bVar23 != 0) * (uVar40 < 0x100) * bVar23 - (0xff < uVar40);
      auVar29[0xd] = (bVar39 != 0) * (uVar42 < 0x100) * bVar39 - (0xff < uVar42);
      auVar29[0xe] = (0 < sVar10) * (sVar10 < 0x100) * cVar5 - (0xff < sVar10);
      auVar29[0xf] = (0 < sVar11) * (sVar11 < 0x100) * cVar6 - (0xff < sVar11);
      auVar29 = auVar29 & auVar18;
      auVar36._0_14_ = auVar29._0_14_;
      auVar36[0xe] = auVar29[7];
      auVar36[0xf] = auVar29[7];
      auVar35._14_2_ = auVar36._14_2_;
      auVar35._0_13_ = auVar29._0_13_;
      auVar35[0xd] = auVar29[6];
      auVar34._13_3_ = auVar35._13_3_;
      auVar34._0_12_ = auVar29._0_12_;
      auVar34[0xc] = auVar29[6];
      auVar33._12_4_ = auVar34._12_4_;
      auVar33._0_11_ = auVar29._0_11_;
      auVar33[0xb] = auVar29[5];
      auVar32._11_5_ = auVar33._11_5_;
      auVar32._0_10_ = auVar29._0_10_;
      auVar32[10] = auVar29[5];
      auVar31._10_6_ = auVar32._10_6_;
      auVar31._0_9_ = auVar29._0_9_;
      auVar31[9] = auVar29[4];
      auVar30._9_7_ = auVar31._9_7_;
      auVar30._0_8_ = auVar29._0_8_;
      auVar30[8] = auVar29[4];
      bVar23 = auVar29[0];
      bVar39 = auVar29[1] * '\x02';
      bVar41 = auVar29[2] * '\x04';
      bVar44 = auVar29[3] * '\b';
      uVar46 = auVar30._8_2_ * 0x10;
      uVar48 = auVar32._10_2_ * 0x20;
      uVar50 = auVar34._12_2_ * 0x40;
      uVar40 = (ushort)bVar39;
      uVar42 = (ushort)bVar41;
      uVar45 = (ushort)bVar44;
      uVar47 = uVar46 & 0xff;
      uVar49 = uVar48 & 0xff;
      uVar51 = uVar50 & 0xff;
      uVar52 = auVar35._14_2_ * 0x80 & 0xff;
      auVar37._0_8_ =
           CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(auVar35._14_2_ * 0x80) -
                    (0xff < uVar52),
                    CONCAT16((uVar51 != 0) * (uVar51 < 0x100) * (char)uVar50 - (0xff < uVar51),
                             CONCAT15((uVar49 != 0) * (uVar49 < 0x100) * (char)uVar48 -
                                      (0xff < uVar49),
                                      CONCAT14((uVar47 != 0) * (uVar47 < 0x100) * (char)uVar46 -
                                               (0xff < uVar47),
                                               CONCAT13((uVar45 != 0) * (uVar45 < 0x100) * bVar44 -
                                                        (0xff < uVar45),
                                                        CONCAT12((uVar42 != 0) * (uVar42 < 0x100) *
                                                                 bVar41 - (0xff < uVar42),
                                                                 CONCAT11((uVar40 != 0) *
                                                                          (uVar40 < 0x100) * bVar39
                                                                          - (0xff < uVar40),
                                                                          (bVar23 != 0) *
                                                                          (bVar23 < 0x100) * bVar23
                                                                          - (0xff < bVar23))))))));
      auVar37._8_8_ = 0;
      uVar43 = (undefined4)(auVar37._0_8_ >> 0x20);
      auVar54._4_4_ = uVar43;
      auVar54._0_4_ = uVar43;
      auVar54._8_4_ = uVar43;
      auVar54._12_4_ = uVar43;
      auVar54 = auVar54 | auVar37;
      auVar38._0_4_ = auVar54._0_4_ >> 0x10;
      auVar38._4_4_ = 0;
      auVar38._8_4_ = auVar54._8_4_ >> 0x10;
      auVar38._12_4_ = auVar54._12_4_ >> 0x10;
      *(byte *)key->rd_key = SUB161(auVar38 | auVar54,1) | SUB161(auVar38 | auVar54,0);
      key = (AES_KEY *)((long)key->rd_key + 1);
      iVar19 = iVar19 + 4;
    } while (iVar19 != 0x10);
    iVar20 = iVar20 + 1;
  } while (iVar20 != 4);
  return;
}

Assistant:

static void AES_encrypt(const AES_state* rounds, int nrounds, unsigned char* cipher16, const unsigned char* plain16) {
    AES_state s = {{0}};
    int round;

    LoadBytes(&s, plain16);
    AddRoundKey(&s, rounds++);

    for (round = 1; round < nrounds; round++) {
        SubBytes(&s, 0);
        ShiftRows(&s);
        MixColumns(&s, 0);
        AddRoundKey(&s, rounds++);
    }

    SubBytes(&s, 0);
    ShiftRows(&s);
    AddRoundKey(&s, rounds);

    SaveBytes(cipher16, &s);
}